

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBranchLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_02;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  bool bVar2;
  Type *this_03;
  int64 iVar3;
  Type *pTVar4;
  BranchLayerParams *pBVar5;
  iterator iVar6;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  Result *_result;
  int iVar10;
  NeuralNetwork *nn;
  NeuralNetworkSpecValidator *this_04;
  NeuralNetwork *nn_00;
  string current_blob_name;
  string condition;
  NeuralNetworkSpecValidator ifNNValidator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  NeuralNetworkSpecValidator elseNNValidator;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,0,0);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ != 0) {
    iVar10 = 0;
    this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                        (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    if ((this_03->dimvalue_).current_size_ != 0) {
      do {
        if ((this_03->dimvalue_).current_size_ <= iVar10) goto LAB_002818d9;
        iVar3 = Specification::Tensor::dimvalue(this_03,iVar10);
        iVar10 = iVar10 + 1;
      } while (iVar3 < 2);
      std::__cxx11::string::string((string *)&condition,(string *)(layer->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elseNNValidator,"Branch Layer \'",&condition);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ifNNValidator,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elseNNValidator,"\' input\'s length cannot be more than 1");
      std::__cxx11::string::~string((string *)&elseNNValidator);
      std::__cxx11::string::~string((string *)&condition);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ifNNValidator);
      this_04 = &ifNNValidator;
      goto LAB_00281c46;
    }
  }
LAB_002818d9:
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(layer->input_).super_RepeatedPtrFieldBase,0);
  std::__cxx11::string::string((string *)&condition,(string *)pTVar4);
  pBVar5 = Specification::NeuralNetworkLayer::branch(layer);
  this_01 = &this->blobs;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&this_01->_M_t,&condition);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->blobs)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&local_110,(string *)(layer->name_).ptr_);
    std::operator+(&local_f0,"Branch Layer \'",&local_110);
    std::operator+(&current_blob_name,&local_f0,"\' requires the condition blob \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &elseNNValidator,&current_blob_name,&condition);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ifNNValidator,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &elseNNValidator,"\' which is not present in the network prior to this layer.");
    std::__cxx11::string::~string((string *)&elseNNValidator);
    std::__cxx11::string::~string((string *)&current_blob_name);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ifNNValidator);
LAB_00281c07:
    std::__cxx11::string::~string((string *)&ifNNValidator);
  }
  else {
    nn_00 = pBVar5->ifbranch_;
    nn = pBVar5->elsebranch_;
    if (nn_00 == (NeuralNetwork *)0x0) {
      nn_00 = (NeuralNetwork *)&Specification::_NeuralNetwork_default_instance_;
    }
    if (nn == (NeuralNetwork *)0x0) {
      nn = (NeuralNetwork *)&Specification::_NeuralNetwork_default_instance_;
    }
    if ((nn_00->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
      std::__cxx11::string::string((string *)&current_blob_name,(string *)(layer->name_).ptr_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elseNNValidator,"Branch Layer \'",&current_blob_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ifNNValidator,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elseNNValidator,"\' has an empty If branch");
      std::__cxx11::string::~string((string *)&elseNNValidator);
      std::__cxx11::string::~string((string *)&current_blob_name);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&ifNNValidator);
      goto LAB_00281c07;
    }
    iVar10 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
    NeuralNetworkSpecValidator
              (&ifNNValidator,this_01,&this->ModelIOBlobNameToRank,this->ndArrayInterpretation,
               this->loopStackDepth,&this->blobNameToRank);
    validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
              (__return_storage_ptr__,&ifNNValidator,nn_00);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      std::__cxx11::string::~string((string *)this_00);
      if (0 < iVar10) {
        NeuralNetworkSpecValidator
                  (&elseNNValidator,this_01,&this->ModelIOBlobNameToRank,this->ndArrayInterpretation
                   ,this->loopStackDepth,&this->blobNameToRank);
        validateNeuralNetwork<CoreML::Specification::NeuralNetwork>
                  (__return_storage_ptr__,&elseNNValidator,nn);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          ~NeuralNetworkSpecValidator(&elseNNValidator);
          goto LAB_00281c37;
        }
        std::__cxx11::string::~string((string *)this_00);
        this_02 = &elseNNValidator.blobs;
        for (p_Var9 = ifNNValidator.blobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &ifNNValidator.blobs._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          std::__cxx11::string::string((string *)&current_blob_name,(string *)(p_Var9 + 1));
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::find(&this_02->_M_t,&current_blob_name);
          if ((_Rb_tree_header *)iVar6._M_node !=
              &elseNNValidator.blobs._M_t._M_impl.super__Rb_tree_header) {
            p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](this_01,&current_blob_name);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&ifNNValidator.blobs,&current_blob_name);
            _Var1._M_node = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&ifNNValidator.blobs,&current_blob_name);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      (p_Var7,_Var1,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(pmVar8->_M_t)._M_impl.super__Rb_tree_header);
            p_Var7 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](this_01,&current_blob_name);
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](this_02,&current_blob_name);
            _Var1._M_node = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](this_02,&current_blob_name);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      (p_Var7,_Var1,
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(pmVar8->_M_t)._M_impl.super__Rb_tree_header);
          }
          std::__cxx11::string::~string((string *)&current_blob_name);
        }
        ~NeuralNetworkSpecValidator(&elseNNValidator);
      }
      Result::Result(__return_storage_ptr__);
    }
LAB_00281c37:
    ~NeuralNetworkSpecValidator(&ifNNValidator);
  }
  this_04 = (NeuralNetworkSpecValidator *)&condition;
LAB_00281c46:
  std::__cxx11::string::~string((string *)this_04);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBranchLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 0, 0));

    if (layer.inputtensor_size()) {
        auto &in_tensor = layer.inputtensor(0);
        if (in_tensor.dimvalue_size()) {
            for (int i=0; i < in_tensor.dimvalue_size(); i++) {
                if (in_tensor.dimvalue(i) > 1) {
                    std::string err = "Branch Layer '" + std::string(layer.name()) + "' input's length cannot be more than 1";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    std::string condition = layer.input(0);

    const auto& params = layer.branch();
    // check that condition is already present in the network
    if (blobs.find(condition) == blobs.end()) {
        std::string err = "Branch Layer '" + std::string(layer.name()) + "' requires the condition blob '"
        + condition + "' which is not present in the network prior to this layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // get the NN spec for If and Else branches
    const auto& ifNNSpec = params.ifbranch();
    const auto& elseNNSpec = params.elsebranch();
    if (ifNNSpec.layers_size() == 0) {
        std::string err = "Branch Layer '" + std::string(layer.name()) + "' has an empty If branch";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    bool isElseBranch = (elseNNSpec.layers_size() > 0) ? true : false;

    // validate both If and Else branches
    NeuralNetworkSpecValidator ifNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);
    HANDLE_RESULT_AND_RETURN_ON_ERROR(ifNNValidator.validateNeuralNetwork(ifNNSpec));

    if (isElseBranch) {
        NeuralNetworkSpecValidator elseNNValidator(blobs, ModelIOBlobNameToRank, ndArrayInterpretation, loopStackDepth, blobNameToRank);
        HANDLE_RESULT_AND_RETURN_ON_ERROR(elseNNValidator.validateNeuralNetwork(elseNNSpec));

        // update set of "blobs" of the current Neural Network: the ones that are in both if and else branches
        for (auto& blob_map: ifNNValidator.blobs){
            std::string current_blob_name = blob_map.first;
            if (elseNNValidator.blobs.find(current_blob_name) != elseNNValidator.blobs.end()){
                // if we are here, this means "current_blob_name" is present in both if and else branch
                blobs[current_blob_name].insert(ifNNValidator.blobs[current_blob_name].begin(),
                                                ifNNValidator.blobs[current_blob_name].end());
                blobs[current_blob_name].insert(elseNNValidator.blobs[current_blob_name].begin(),
                                                elseNNValidator.blobs[current_blob_name].end());
            }
        }
    }

    return Result();
}